

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

void __thiscall
libtorrent::tracker_error_alert::tracker_error_alert
          (tracker_error_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,int times
          ,string_view u,error_code *e,string_view m)

{
  undefined3 uVar1;
  bool bVar2;
  allocation_slot aVar3;
  error_category *peVar4;
  error_category *rhs;
  int local_9c;
  error_code *e_local;
  int times_local;
  endpoint *ep_local;
  torrent_handle *h_local;
  stack_allocator *alloc_local;
  tracker_error_alert *this_local;
  
  tracker_alert::tracker_alert(&this->super_tracker_alert,alloc,h,ep,u);
  (this->super_tracker_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__tracker_error_alert_00990790;
  this->times_in_row = times;
  bVar2 = e->failed_;
  uVar1 = *(undefined3 *)&e->field_0x5;
  peVar4 = e->cat_;
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar2;
  *(undefined3 *)&(this->error).field_0x5 = uVar1;
  (this->error).cat_ = peVar4;
  aVar3 = libtorrent::aux::stack_allocator::copy_string(alloc,m);
  (this->m_msg_idx).m_idx = aVar3.m_idx;
  bVar2 = boost::system::error_code::operator_cast_to_bool(e);
  if (bVar2) {
    peVar4 = boost::system::error_code::category(e);
    rhs = http_category();
    bVar2 = boost::system::error_category::operator==(peVar4,rhs);
    if (bVar2) {
      local_9c = boost::system::error_code::value(e);
      goto LAB_001e9b57;
    }
  }
  local_9c = -1;
LAB_001e9b57:
  this->status_code = local_9c;
  boost::basic_string_view::operator_cast_to_string(&this->msg,(basic_string_view *)&m);
  return;
}

Assistant:

tracker_error_alert::tracker_error_alert(aux::stack_allocator& alloc
		, torrent_handle const& h, tcp::endpoint const& ep, int times
		, string_view u, error_code const& e, string_view m)
		: tracker_alert(alloc, h, ep, u)
		, times_in_row(times)
		, error(e)
		, m_msg_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, status_code(e && e.category() == http_category() ? e.value() : -1)
		, msg(m)
#endif
	{
		TORRENT_ASSERT(!u.empty());
	}